

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleUploadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool bVar2;
  CURLcode CVar3;
  string *psVar4;
  long lVar5;
  long lVar6;
  FILE *__stream;
  unsigned_long uVar7;
  CURL_conflict *data;
  curl_slist *list;
  ostream *poVar8;
  char *pcVar9;
  string *h;
  pointer pbVar10;
  pointer pbVar11;
  bool bVar12;
  cURLProgressHelper helper;
  cURLEasyGuard g_curl;
  string err;
  cmFileCommandVectorOfChar chunkDebug;
  string local_188;
  cmFileCommandVectorOfChar chunkResponse;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string logVar;
  string local_110;
  undefined7 uStack_10f;
  string netrc_level;
  string userpwd;
  string statusVar;
  string filename;
  string netrc_file;
  string url;
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"UPLOAD must be called with at least three arguments.",
               (allocator<char> *)&helper);
    cmCommand::SetError(&this->super_cmCommand,&err);
    std::__cxx11::string::~string((string *)&err);
    return false;
  }
  std::__cxx11::string::string((string *)&filename,(string *)(pbVar11 + 1));
  std::__cxx11::string::string((string *)&url,(string *)(pbVar11 + 2));
  logVar._M_dataplus._M_p = (pointer)&logVar.field_2;
  logVar._M_string_length = 0;
  statusVar._M_dataplus._M_p = (pointer)&statusVar.field_2;
  statusVar._M_string_length = 0;
  userpwd._M_dataplus._M_p = (pointer)&userpwd.field_2;
  userpwd._M_string_length = 0;
  logVar.field_2._M_local_buf[0] = '\0';
  statusVar.field_2._M_local_buf[0] = '\0';
  userpwd.field_2._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"CMAKE_NETRC",(allocator<char> *)&helper);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&err);
  std::__cxx11::string::string((string *)&netrc_level,(string *)psVar4);
  std::__cxx11::string::~string((string *)&err);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"CMAKE_NETRC_FILE",(allocator<char> *)&helper);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&err);
  std::__cxx11::string::string((string *)&netrc_file,(string *)psVar4);
  std::__cxx11::string::~string((string *)&err);
  curl_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  curl_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  curl_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar12 = false;
  lVar6 = 0;
  lVar5 = 0;
  for (pbVar11 = pbVar11 + 3;
      pbVar11 !=
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
    bVar2 = std::operator==(pbVar11,"TIMEOUT");
    if (bVar2) {
      pbVar11 = pbVar11 + 1;
      if (pbVar11 ==
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"UPLOAD missing time for TIMEOUT.",(allocator<char> *)&helper);
        cmCommand::SetError(&this->super_cmCommand,&err);
        goto LAB_001961c3;
      }
      lVar5 = atol((pbVar11->_M_dataplus)._M_p);
    }
    else {
      bVar2 = std::operator==(pbVar11,"INACTIVITY_TIMEOUT");
      if (bVar2) {
        pbVar11 = pbVar11 + 1;
        if (pbVar11 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"UPLOAD missing time for INACTIVITY_TIMEOUT.",
                     (allocator<char> *)&helper);
          cmCommand::SetError(&this->super_cmCommand,&err);
          goto LAB_001961c3;
        }
        lVar6 = atol((pbVar11->_M_dataplus)._M_p);
      }
      else {
        bVar2 = std::operator==(pbVar11,"LOG");
        if (bVar2) {
          pbVar11 = pbVar11 + 1;
          if (pbVar11 ==
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&err,"UPLOAD missing VAR for LOG.",(allocator<char> *)&helper);
            cmCommand::SetError(&this->super_cmCommand,&err);
            goto LAB_001961c3;
          }
          std::__cxx11::string::_M_assign((string *)&logVar);
        }
        else {
          bVar2 = std::operator==(pbVar11,"STATUS");
          if (bVar2) {
            pbVar11 = pbVar11 + 1;
            if (pbVar11 ==
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&err,"UPLOAD missing VAR for STATUS.",(allocator<char> *)&helper)
              ;
              cmCommand::SetError(&this->super_cmCommand,&err);
              goto LAB_001961c3;
            }
            std::__cxx11::string::_M_assign((string *)&statusVar);
          }
          else {
            bVar2 = std::operator==(pbVar11,"SHOW_PROGRESS");
            if (bVar2) {
              bVar12 = true;
            }
            else {
              bVar2 = std::operator==(pbVar11,"NETRC_FILE");
              if (bVar2) {
                pbVar11 = pbVar11 + 1;
                if (pbVar11 ==
                    (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&err,"UPLOAD missing file value for NETRC_FILE.",
                             (allocator<char> *)&helper);
                  cmCommand::SetError(&this->super_cmCommand,&err);
                  goto LAB_001961c3;
                }
                std::__cxx11::string::_M_assign((string *)&netrc_file);
              }
              else {
                bVar2 = std::operator==(pbVar11,"NETRC");
                if (bVar2) {
                  pbVar11 = pbVar11 + 1;
                  if (pbVar11 ==
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&err,"UPLOAD missing level value for NETRC.",
                               (allocator<char> *)&helper);
                    cmCommand::SetError(&this->super_cmCommand,&err);
                    goto LAB_001961c3;
                  }
                  std::__cxx11::string::_M_assign((string *)&netrc_level);
                }
                else {
                  bVar2 = std::operator==(pbVar11,"USERPWD");
                  if (bVar2) {
                    pbVar11 = pbVar11 + 1;
                    if (pbVar11 ==
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&err,"UPLOAD missing string for USERPWD.",
                                 (allocator<char> *)&helper);
                      cmCommand::SetError(&this->super_cmCommand,&err);
                      goto LAB_001961c3;
                    }
                    std::__cxx11::string::_M_assign((string *)&userpwd);
                  }
                  else {
                    bVar2 = std::operator==(pbVar11,"HTTPHEADER");
                    if (bVar2) {
                      pbVar11 = pbVar11 + 1;
                      if (pbVar11 ==
                          (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&err,"UPLOAD missing string for HTTPHEADER.",
                                   (allocator<char> *)&helper);
                        cmCommand::SetError(&this->super_cmCommand,&err);
                        goto LAB_001961c3;
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&curl_headers,pbVar11);
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&err,"Unexpected argument: ",(allocator<char> *)&helper);
                      std::__cxx11::string::append((string *)&err);
                      cmMakefile::IssueMessage((this->super_cmCommand).Makefile,AUTHOR_WARNING,&err)
                      ;
                      std::__cxx11::string::~string((string *)&err);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __stream = (FILE *)cmsys::SystemTools::Fopen(&filename,"rb");
  if (__stream == (FILE *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"UPLOAD cannot open file \'",(allocator<char> *)&helper);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&helper,
                   &filename,"\' for reading.");
    std::__cxx11::string::append((string *)&err);
    std::__cxx11::string::~string((string *)&helper);
    cmCommand::SetError(&this->super_cmCommand,&err);
LAB_001961c3:
    std::__cxx11::string::~string((string *)&err);
  }
  else {
    uVar7 = cmsys::SystemTools::FileLength(&filename);
    curl_global_init(3);
    data = curl_easy_init();
    if (data != (CURL_conflict *)0x0) {
      g_curl.Easy = data;
      CVar3 = curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
      if (CVar3 == CURLE_OK) {
        CVar3 = curl_easy_setopt(data,CURLOPT_UPLOAD,1);
        if (CVar3 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"UPLOAD cannot set upload flag: ",(allocator<char> *)&helper);
          curl_easy_strerror(CVar3);
          std::__cxx11::string::append((char *)&err);
          cmCommand::SetError(&this->super_cmCommand,&err);
          goto LAB_001960b4;
        }
        CVar3 = curl_easy_setopt(data,CURLOPT_URL,url._M_dataplus._M_p);
        if (CVar3 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"UPLOAD cannot set url: ",(allocator<char> *)&helper);
          curl_easy_strerror(CVar3);
          std::__cxx11::string::append((char *)&err);
          cmCommand::SetError(&this->super_cmCommand,&err);
          goto LAB_001960b4;
        }
        CVar3 = curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,
                                 anon_unknown.dwarf_2fa26a::cmWriteToMemoryCallback);
        if (CVar3 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"UPLOAD cannot set write function: ",(allocator<char> *)&helper)
          ;
          curl_easy_strerror(CVar3);
          std::__cxx11::string::append((char *)&err);
          cmCommand::SetError(&this->super_cmCommand,&err);
          goto LAB_001960b4;
        }
        CVar3 = curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,
                                 anon_unknown.dwarf_2fa26a::cmFileCommandCurlDebugCallback);
        if (CVar3 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"UPLOAD cannot set debug function: ",(allocator<char> *)&helper)
          ;
          curl_easy_strerror(CVar3);
          std::__cxx11::string::append((char *)&err);
          cmCommand::SetError(&this->super_cmCommand,&err);
          goto LAB_001960b4;
        }
        chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        CVar3 = curl_easy_setopt(data,CURLOPT_WRITEDATA);
        if (CVar3 == CURLE_OK) {
          CVar3 = curl_easy_setopt(data,CURLOPT_DEBUGDATA,&chunkDebug);
          if (CVar3 != CURLE_OK) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&err,"UPLOAD cannot set debug data: ",(allocator<char> *)&helper);
            curl_easy_strerror(CVar3);
            std::__cxx11::string::append((char *)&err);
            cmCommand::SetError(&this->super_cmCommand,&err);
            goto LAB_001962f2;
          }
          CVar3 = curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
          if (CVar3 != CURLE_OK) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&err,"UPLOAD cannot set follow-redirect option: ",
                       (allocator<char> *)&helper);
            curl_easy_strerror(CVar3);
            std::__cxx11::string::append((char *)&err);
            cmCommand::SetError(&this->super_cmCommand,&err);
            goto LAB_001962f2;
          }
          if ((logVar._M_string_length != 0) &&
             (CVar3 = curl_easy_setopt(data,CURLOPT_VERBOSE,1), CVar3 != CURLE_OK)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&err,"UPLOAD cannot set verbose: ",(allocator<char> *)&helper);
            curl_easy_strerror(CVar3);
            std::__cxx11::string::append((char *)&err);
            cmCommand::SetError(&this->super_cmCommand,&err);
            goto LAB_001962f2;
          }
          if ((0 < lVar5) &&
             (CVar3 = curl_easy_setopt(data,CURLOPT_TIMEOUT,lVar5), CVar3 != CURLE_OK)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&err,"UPLOAD cannot set timeout: ",(allocator<char> *)&helper);
            curl_easy_strerror(CVar3);
            std::__cxx11::string::append((char *)&err);
            cmCommand::SetError(&this->super_cmCommand,&err);
            goto LAB_001962f2;
          }
          if (0 < lVar6) {
            curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
            curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,lVar6);
          }
          anon_unknown.dwarf_2fa26a::cURLProgressHelper::cURLProgressHelper(&helper,this,"upload");
          if (bVar12) {
            CVar3 = curl_easy_setopt(data,CURLOPT_NOPROGRESS,0);
            if (CVar3 == CURLE_OK) {
              CVar3 = curl_easy_setopt(data,CURLOPT_PROGRESSFUNCTION,
                                       anon_unknown.dwarf_2fa26a::cmFileUploadProgressCallback);
              if (CVar3 == CURLE_OK) {
                CVar3 = curl_easy_setopt(data,CURLOPT_PROGRESSDATA,&helper);
                if (CVar3 == CURLE_OK) goto LAB_0019652c;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&err,"UPLOAD cannot set progress data: ",
                           (allocator<char> *)&local_188);
                curl_easy_strerror(CVar3);
                std::__cxx11::string::append((char *)&err);
                cmCommand::SetError(&this->super_cmCommand,&err);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&err,"UPLOAD cannot set progress function: ",
                           (allocator<char> *)&local_188);
                curl_easy_strerror(CVar3);
                std::__cxx11::string::append((char *)&err);
                cmCommand::SetError(&this->super_cmCommand,&err);
              }
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&err,"UPLOAD cannot set noprogress value: ",
                         (allocator<char> *)&local_188);
              curl_easy_strerror(CVar3);
              std::__cxx11::string::append((char *)&err);
              cmCommand::SetError(&this->super_cmCommand,&err);
            }
LAB_001965d4:
            std::__cxx11::string::~string((string *)&err);
            bVar12 = false;
          }
          else {
LAB_0019652c:
            CVar3 = curl_easy_setopt(data,CURLOPT_READDATA,__stream);
            if (CVar3 != CURLE_OK) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&err,"UPLOAD cannot set input file: ",
                         (allocator<char> *)&local_188);
              curl_easy_strerror(CVar3);
              std::__cxx11::string::append((char *)&err);
              cmCommand::SetError(&this->super_cmCommand,&err);
              goto LAB_001965d4;
            }
            CVar3 = curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar7);
            if (CVar3 != CURLE_OK) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&err,"UPLOAD cannot set input file size: ",
                         (allocator<char> *)&local_188);
              curl_easy_strerror(CVar3);
              std::__cxx11::string::append((char *)&err);
              cmCommand::SetError(&this->super_cmCommand,&err);
              goto LAB_001965d4;
            }
            if ((userpwd._M_string_length != 0) &&
               (CVar3 = curl_easy_setopt(data,CURLOPT_USERPWD,userpwd._M_dataplus._M_p),
               CVar3 != CURLE_OK)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&err,"UPLOAD cannot set user password: ",
                         (allocator<char> *)&local_188);
              curl_easy_strerror(CVar3);
              std::__cxx11::string::append((char *)&err);
              cmCommand::SetError(&this->super_cmCommand,&err);
              goto LAB_001965d4;
            }
            cmsys::SystemTools::UpperCase(&err,&netrc_level);
            std::__cxx11::string::operator=((string *)&netrc_level,(string *)&err);
            std::__cxx11::string::~string((string *)&err);
            cmCurlSetNETRCOption(&local_188,data,&netrc_level,&netrc_file);
            pbVar11 = curl_headers.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            bVar12 = local_188._M_string_length == 0;
            if (bVar12) {
              list = (curl_slist *)0x0;
              for (pbVar10 = curl_headers.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar11;
                  pbVar10 = pbVar10 + 1) {
                list = curl_slist_append(list,(pbVar10->_M_dataplus)._M_p);
              }
              curl_easy_setopt(data,CURLOPT_HTTPHEADER,list);
              CVar3 = curl_easy_perform(data);
              curl_slist_free_all(list);
              g_curl.Easy = (CURL *)0x0;
              curl_easy_cleanup(data);
              if (statusVar._M_string_length != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
                poVar8 = (ostream *)std::ostream::operator<<(&err,CVar3);
                poVar8 = std::operator<<(poVar8,";\"");
                pcVar9 = curl_easy_strerror(CVar3);
                poVar8 = std::operator<<(poVar8,pcVar9);
                std::operator<<(poVar8,"\"");
                pcVar1 = (this->super_cmCommand).Makefile;
                std::__cxx11::stringbuf::str();
                cmMakefile::AddDefinition(pcVar1,&statusVar,(char *)CONCAT71(uStack_10f,local_110));
                std::__cxx11::string::~string(&local_110);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
              }
              curl_global_cleanup();
              fclose(__stream);
              if (logVar._M_string_length != 0) {
                err._M_dataplus._M_p = (pointer)&err.field_2;
                err._M_string_length = 0;
                err.field_2._M_local_buf[0] = '\0';
                if (chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_110 = (string)0x0;
                  std::vector<char,_std::allocator<char>_>::emplace_back<char>
                            (&chunkResponse,(char *)&local_110);
                  std::__cxx11::string::append((char *)&err);
                  std::__cxx11::string::append((char *)&err);
                  std::__cxx11::string::append((char *)&err);
                }
                if (chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_110 = (string)0x0;
                  std::vector<char,_std::allocator<char>_>::emplace_back<char>
                            (&chunkDebug,(char *)&local_110);
                  std::__cxx11::string::append((char *)&err);
                  std::__cxx11::string::append((char *)&err);
                  std::__cxx11::string::append((char *)&err);
                }
                cmMakefile::AddDefinition
                          ((this->super_cmCommand).Makefile,&logVar,err._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&err);
              }
            }
            else {
              cmCommand::SetError(&this->super_cmCommand,&local_188);
            }
            std::__cxx11::string::~string((string *)&local_188);
          }
          std::__cxx11::string::~string((string *)&helper.Text);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"UPLOAD cannot set write data: ",(allocator<char> *)&helper);
          curl_easy_strerror(CVar3);
          std::__cxx11::string::append((char *)&err);
          cmCommand::SetError(&this->super_cmCommand,&err);
LAB_001962f2:
          std::__cxx11::string::~string((string *)&err);
          bVar12 = false;
        }
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&chunkDebug.super__Vector_base<char,_std::allocator<char>_>);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&chunkResponse.super__Vector_base<char,_std::allocator<char>_>);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"UPLOAD cannot set fail on error flag: ",
                   (allocator<char> *)&helper);
        curl_easy_strerror(CVar3);
        std::__cxx11::string::append((char *)&err);
        cmCommand::SetError(&this->super_cmCommand,&err);
LAB_001960b4:
        std::__cxx11::string::~string((string *)&err);
        bVar12 = false;
      }
      anon_unknown.dwarf_2fa26a::cURLEasyGuard::~cURLEasyGuard(&g_curl);
      goto LAB_001961cf;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"UPLOAD error initializing curl.",(allocator<char> *)&helper);
    cmCommand::SetError(&this->super_cmCommand,&err);
    std::__cxx11::string::~string((string *)&err);
    fclose(__stream);
  }
  bVar12 = false;
LAB_001961cf:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&curl_headers);
  std::__cxx11::string::~string((string *)&netrc_file);
  std::__cxx11::string::~string((string *)&netrc_level);
  std::__cxx11::string::~string((string *)&userpwd);
  std::__cxx11::string::~string((string *)&statusVar);
  std::__cxx11::string::~string((string *)&logVar);
  std::__cxx11::string::~string((string *)&url);
  std::__cxx11::string::~string((string *)&filename);
  return bVar12;
}

Assistant:

bool cmFileCommand::HandleUploadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  if (args.size() < 3) {
    this->SetError("UPLOAD must be called with at least three arguments.");
    return false;
  }
  std::vector<std::string>::const_iterator i = args.begin();
  ++i;
  std::string filename = *i;
  ++i;
  std::string url = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool showProgress = false;
  std::string userpwd;
  std::string netrc_level = this->Makefile->GetSafeDefinition("CMAKE_NETRC");
  std::string netrc_file =
    this->Makefile->GetSafeDefinition("CMAKE_NETRC_FILE");

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        this->SetError("UPLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        this->SetError("UPLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        this->SetError("UPLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        this->SetError("UPLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "NETRC_FILE") {
      ++i;
      if (i != args.end()) {
        netrc_file = *i;
      } else {
        this->SetError("UPLOAD missing file value for NETRC_FILE.");
        return false;
      }
    } else if (*i == "NETRC") {
      ++i;
      if (i != args.end()) {
        netrc_level = *i;
      } else {
        this->SetError("UPLOAD missing level value for NETRC.");
        return false;
      }
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        this->SetError("UPLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        this->SetError("UPLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = "Unexpected argument: ";
      err += *i;
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, err);
    }

    ++i;
  }

  // Open file for reading:
  //
  FILE* fin = cmsys::SystemTools::Fopen(filename, "rb");
  if (!fin) {
    std::string errStr = "UPLOAD cannot open file '";
    errStr += filename + "' for reading.";
    this->SetError(errStr);
    return false;
  }

  unsigned long file_size = cmsys::SystemTools::FileLength(filename);

#  if defined(_WIN32)
  url = fix_file_url_windows(url);
#  endif

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    this->SetError("UPLOAD error initializing curl.");
    fclose(fin);
    return false;
  }

  cURLEasyGuard g_curl(curl);

  // enable HTTP ERROR parsing
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "UPLOAD cannot set fail on error flag: ");

  // enable uploading
  res = ::curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);
  check_curl_result(res, "UPLOAD cannot set upload flag: ");

  res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "UPLOAD cannot set url: ");

  res =
    ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToMemoryCallback);
  check_curl_result(res, "UPLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "UPLOAD cannot set debug function: ");

  cmFileCommandVectorOfChar chunkResponse;
  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, &chunkResponse);
  check_curl_result(res, "UPLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);
  check_curl_result(res, "UPLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "UPLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "UPLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "UPLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "upload");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "UPLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION,
                             cmFileUploadProgressCallback);
    check_curl_result(res, "UPLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "UPLOAD cannot set progress data: ");
  }

  // now specify which file to upload
  res = ::curl_easy_setopt(curl, CURLOPT_INFILE, fin);
  check_curl_result(res, "UPLOAD cannot set input file: ");

  // and give the size of the upload (optional)
  res =
    ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(file_size));
  check_curl_result(res, "UPLOAD cannot set input file size: ");

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "UPLOAD cannot set user password: ");
  }

  // check to see if netrc parameters have been specified
  // local command args takes precedence over CMAKE_NETRC*
  netrc_level = cmSystemTools::UpperCase(netrc_level);
  std::string const& netrc_option_err =
    cmCurlSetNETRCOption(curl, netrc_level, netrc_file);
  if (!netrc_option_err.empty()) {
    this->SetError(netrc_option_err);
    return false;
  }

  struct curl_slist* headers = nullptr;
  for (std::string const& h : curl_headers) {
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    std::ostringstream result;
    result << static_cast<int>(res) << ";\"" << ::curl_easy_strerror(res)
           << "\"";
    this->Makefile->AddDefinition(statusVar, result.str().c_str());
  }

  ::curl_global_cleanup();

  fclose(fin);
  fin = nullptr;

  if (!logVar.empty()) {
    std::string log;

    if (!chunkResponse.empty()) {
      chunkResponse.push_back(0);
      log += "Response:\n";
      log += chunkResponse.data();
      log += "\n";
    }

    if (!chunkDebug.empty()) {
      chunkDebug.push_back(0);
      log += "Debug:\n";
      log += chunkDebug.data();
      log += "\n";
    }

    this->Makefile->AddDefinition(logVar, log.c_str());
  }

  return true;
#else
  this->SetError("UPLOAD not supported by bootstrap cmake.");
  return false;
#endif
}